

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigs.h
# Opt level: O3

int __thiscall
sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::connect
          (BasicSignal<int_(),_std::lock_guard<std::mutex>_> *this,int __fd,sockaddr *__addr,
          socklen_t __len)

{
  undefined1 *puVar1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<sigs::ConnectionBase> *conn;
  undefined4 in_register_00000034;
  _func_void *p_Var3;
  function<void()> *this_00;
  _Any_data local_68;
  pointer local_58;
  undefined8 uStack_50;
  function<void()> *local_48;
  pointer local_40;
  sockaddr *local_38;
  
  p_Var3 = (_func_void *)CONCAT44(in_register_00000034,__fd);
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)(p_Var3 + 0x20));
  if (iVar2 == 0) {
    local_58 = (pointer)operator_new(0x30);
    *(undefined8 *)((long)&(local_58->slot_).super__Function_base._M_functor + 8) = 0x100000001;
    *(undefined ***)&(local_58->slot_).super__Function_base._M_functor =
         &PTR___Sp_counted_ptr_inplace_0016fe38;
    local_68._8_8_ = &(local_58->slot_).super__Function_base._M_manager;
    (local_58->slot_).super__Function_base._M_manager = (_Manager_type)0x0;
    (local_58->slot_)._M_invoker = (_Invoker_type)0x0;
    (local_58->conn_).super___shared_ptr<sigs::ConnectionBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (local_58->conn_).super___shared_ptr<sigs::ConnectionBase,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->entries).
    super__Vector_base<sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::Entry>_>
    ._M_impl.super__Vector_impl_data._M_start = local_58;
    this->_vptr_BasicSignal = (_func_int **)local_68._8_8_;
    if (__libc_single_threaded == '\0') {
      LOCK();
      puVar1 = (undefined1 *)((long)&(local_58->slot_).super__Function_base._M_functor + 8);
      *(int *)puVar1 = *(int *)puVar1 + 1;
      UNLOCK();
      this_00 = (function<void()> *)this->_vptr_BasicSignal;
    }
    else {
      *(undefined4 *)((long)&(local_58->slot_).super__Function_base._M_functor + 8) = 2;
      this_00 = (function<void()> *)local_68._8_8_;
    }
    local_68._M_unused._M_function_pointer = p_Var3;
    std::function<void()>::operator=(this_00,(anon_class_24_2_3fde98e7 *)&local_68);
    if (local_58 != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58);
    }
    local_40 = (this->entries).
               super__Vector_base<sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::Entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (local_40 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        puVar1 = (undefined1 *)((long)&(local_40->slot_).super__Function_base._M_functor + 8);
        *(int *)puVar1 = *(int *)puVar1 + 1;
        UNLOCK();
      }
      else {
        puVar1 = (undefined1 *)((long)&(local_40->slot_).super__Function_base._M_functor + 8);
        *(int *)puVar1 = *(int *)puVar1 + 1;
      }
    }
    local_58 = (pointer)0x0;
    uStack_50 = 0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    local_48 = this_00;
    local_38 = __addr;
    std::
    vector<sigs::BasicSignal<int(),std::lock_guard<std::mutex>>::Entry,std::allocator<sigs::BasicSignal<int(),std::lock_guard<std::mutex>>::Entry>>
    ::emplace_back<sigs::BasicSignal<int(),std::lock_guard<std::mutex>>::Entry>
              ((vector<sigs::BasicSignal<int(),std::lock_guard<std::mutex>>::Entry,std::allocator<sigs::BasicSignal<int(),std::lock_guard<std::mutex>>::Entry>>
                *)(p_Var3 + 8),(Entry *)&local_68);
    if (local_40 != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40);
    }
    if (local_58 != (pointer)0x0) {
      (*(code *)local_58)(&local_68,&local_68,3);
    }
    pthread_mutex_unlock((pthread_mutex_t *)(p_Var3 + 0x20));
    return (int)this;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

Connection connect(BasicSignal &signal) noexcept
  {
    Lock lock(entriesMutex);
    auto conn = makeConnection();
    entries.emplace_back(Entry(&signal, conn));
    return conn;
  }